

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eigen_Colamd.h
# Opt level: O0

bool Eigen::internal::colamd<int>
               (int n_row,int n_col,int Alen,int *A,int *p,double *knobs,int *stats)

{
  int iVar1;
  double local_118;
  double default_knobs [20];
  int local_70;
  int local_6c;
  int max_deg;
  int ngarbage;
  int n_row2;
  int n_col2;
  colamd_col<int> *Col;
  Colamd_Row<int> *Row;
  int local_48;
  int need;
  int Col_size;
  int Row_size;
  int nnz;
  int i;
  double *knobs_local;
  int *p_local;
  int *A_local;
  int Alen_local;
  int n_col_local;
  int n_row_local;
  
  if (stats == (int *)0x0) {
    n_col_local._3_1_ = false;
  }
  else {
    for (Row_size = 0; Row_size < 0x14; Row_size = Row_size + 1) {
      stats[Row_size] = 0;
    }
    stats[3] = 0;
    stats[4] = -1;
    stats[5] = -1;
    if (A == (int *)0x0) {
      stats[3] = -1;
      n_col_local._3_1_ = false;
    }
    else if (p == (int *)0x0) {
      stats[3] = -2;
      n_col_local._3_1_ = false;
    }
    else if (n_row < 0) {
      stats[3] = -3;
      stats[4] = n_row;
      n_col_local._3_1_ = false;
    }
    else if (n_col < 0) {
      stats[3] = -4;
      stats[4] = n_col;
      n_col_local._3_1_ = false;
    }
    else {
      Col_size = p[n_col];
      if (Col_size < 0) {
        stats[3] = -5;
        stats[4] = Col_size;
        n_col_local._3_1_ = false;
      }
      else if (*p == 0) {
        _nnz = knobs;
        knobs_local = (double *)p;
        p_local = A;
        A_local._0_4_ = Alen;
        A_local._4_4_ = n_col;
        Alen_local = n_row;
        if (knobs == (double *)0x0) {
          colamd_set_defaults(&local_118);
          _nnz = &local_118;
        }
        local_48 = colamd_c<int>(A_local._4_4_);
        need = colamd_r<int>(Alen_local);
        Row._4_4_ = Col_size * 2 + A_local._4_4_ + local_48 + need;
        if ((int)A_local < Row._4_4_) {
          stats[3] = -7;
          stats[4] = Row._4_4_;
          stats[5] = (int)A_local;
          n_col_local._3_1_ = false;
        }
        else {
          A_local._0_4_ = (int)A_local - (local_48 + need);
          _n_row2 = (colamd_col<int> *)(p_local + (int)A_local);
          Col = (colamd_col<int> *)(p_local + ((int)A_local + local_48));
          iVar1 = init_rows_cols<int>(Alen_local,A_local._4_4_,(Colamd_Row<int> *)Col,_n_row2,
                                      p_local,(int *)knobs_local,stats);
          if (iVar1 == 0) {
            n_col_local._3_1_ = false;
          }
          else {
            init_scoring<int>(Alen_local,A_local._4_4_,(Colamd_Row<int> *)Col,_n_row2,p_local,
                              (int *)knobs_local,_nnz,&max_deg,&ngarbage,&local_70);
            local_6c = find_ordering<int>(Alen_local,A_local._4_4_,(int)A_local,
                                          (Colamd_Row<int> *)Col,_n_row2,p_local,(int *)knobs_local,
                                          ngarbage,local_70,Col_size << 1);
            order_children<int>(A_local._4_4_,_n_row2,(int *)knobs_local);
            *stats = Alen_local - max_deg;
            stats[1] = A_local._4_4_ - ngarbage;
            stats[2] = local_6c;
            n_col_local._3_1_ = true;
          }
        }
      }
      else {
        stats[3] = -6;
        stats[4] = *p;
        n_col_local._3_1_ = false;
      }
    }
  }
  return n_col_local._3_1_;
}

Assistant:

static bool colamd(Index n_row, Index n_col, Index Alen, Index *A, Index *p, double knobs[COLAMD_KNOBS], Index stats[COLAMD_STATS])
{
  /* === Local variables ================================================== */
  
  Index i ;     /* loop index */
  Index nnz ;     /* nonzeros in A */
  Index Row_size ;    /* size of Row [], in integers */
  Index Col_size ;    /* size of Col [], in integers */
  Index need ;      /* minimum required length of A */
  Colamd_Row<Index> *Row ;   /* pointer into A of Row [0..n_row] array */
  colamd_col<Index> *Col ;   /* pointer into A of Col [0..n_col] array */
  Index n_col2 ;    /* number of non-dense, non-empty columns */
  Index n_row2 ;    /* number of non-dense, non-empty rows */
  Index ngarbage ;    /* number of garbage collections performed */
  Index max_deg ;   /* maximum row degree */
  double default_knobs [COLAMD_KNOBS] ; /* default knobs array */
  
  
  /* === Check the input arguments ======================================== */
  
  if (!stats)
  {
    COLAMD_DEBUG0 (("colamd: stats not present\n")) ;
    return (false) ;
  }
  for (i = 0 ; i < COLAMD_STATS ; i++)
  {
    stats [i] = 0 ;
  }
  stats [COLAMD_STATUS] = COLAMD_OK ;
  stats [COLAMD_INFO1] = -1 ;
  stats [COLAMD_INFO2] = -1 ;
  
  if (!A)   /* A is not present */
  {
    stats [COLAMD_STATUS] = COLAMD_ERROR_A_not_present ;
    COLAMD_DEBUG0 (("colamd: A not present\n")) ;
    return (false) ;
  }
  
  if (!p)   /* p is not present */
  {
    stats [COLAMD_STATUS] = COLAMD_ERROR_p_not_present ;
    COLAMD_DEBUG0 (("colamd: p not present\n")) ;
    return (false) ;
  }
  
  if (n_row < 0)  /* n_row must be >= 0 */
  {
    stats [COLAMD_STATUS] = COLAMD_ERROR_nrow_negative ;
    stats [COLAMD_INFO1] = n_row ;
    COLAMD_DEBUG0 (("colamd: nrow negative %d\n", n_row)) ;
    return (false) ;
  }
  
  if (n_col < 0)  /* n_col must be >= 0 */
  {
    stats [COLAMD_STATUS] = COLAMD_ERROR_ncol_negative ;
    stats [COLAMD_INFO1] = n_col ;
    COLAMD_DEBUG0 (("colamd: ncol negative %d\n", n_col)) ;
    return (false) ;
  }
  
  nnz = p [n_col] ;
  if (nnz < 0)  /* nnz must be >= 0 */
  {
    stats [COLAMD_STATUS] = COLAMD_ERROR_nnz_negative ;
    stats [COLAMD_INFO1] = nnz ;
    COLAMD_DEBUG0 (("colamd: number of entries negative %d\n", nnz)) ;
    return (false) ;
  }
  
  if (p [0] != 0)
  {
    stats [COLAMD_STATUS] = COLAMD_ERROR_p0_nonzero ;
    stats [COLAMD_INFO1] = p [0] ;
    COLAMD_DEBUG0 (("colamd: p[0] not zero %d\n", p [0])) ;
    return (false) ;
  }
  
  /* === If no knobs, set default knobs =================================== */
  
  if (!knobs)
  {
    colamd_set_defaults (default_knobs) ;
    knobs = default_knobs ;
  }
  
  /* === Allocate the Row and Col arrays from array A ===================== */
  
  Col_size = colamd_c (n_col) ;
  Row_size = colamd_r (n_row) ;
  need = 2*nnz + n_col + Col_size + Row_size ;
  
  if (need > Alen)
  {
    /* not enough space in array A to perform the ordering */
    stats [COLAMD_STATUS] = COLAMD_ERROR_A_too_small ;
    stats [COLAMD_INFO1] = need ;
    stats [COLAMD_INFO2] = Alen ;
    COLAMD_DEBUG0 (("colamd: Need Alen >= %d, given only Alen = %d\n", need,Alen));
    return (false) ;
  }
  
  Alen -= Col_size + Row_size ;
  Col = (colamd_col<Index> *) &A [Alen] ;
  Row = (Colamd_Row<Index> *) &A [Alen + Col_size] ;

  /* === Construct the row and column data structures ===================== */
  
  if (!Eigen::internal::init_rows_cols (n_row, n_col, Row, Col, A, p, stats))
  {
    /* input matrix is invalid */
    COLAMD_DEBUG0 (("colamd: Matrix invalid\n")) ;
    return (false) ;
  }
  
  /* === Initialize scores, kill dense rows/columns ======================= */

  Eigen::internal::init_scoring (n_row, n_col, Row, Col, A, p, knobs,
		&n_row2, &n_col2, &max_deg) ;
  
  /* === Order the supercolumns =========================================== */
  
  ngarbage = Eigen::internal::find_ordering (n_row, n_col, Alen, Row, Col, A, p,
			    n_col2, max_deg, 2*nnz) ;
  
  /* === Order the non-principal columns ================================== */
  
  Eigen::internal::order_children (n_col, Col, p) ;
  
  /* === Return statistics in stats ======================================= */
  
  stats [COLAMD_DENSE_ROW] = n_row - n_row2 ;
  stats [COLAMD_DENSE_COL] = n_col - n_col2 ;
  stats [COLAMD_DEFRAG_COUNT] = ngarbage ;
  COLAMD_DEBUG0 (("colamd: done.\n")) ; 
  return (true) ;
}